

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

LY_ERR eval_number(ly_ctx *ctx,lyxp_expr *exp,uint32_t *tok_idx,lyxp_set *set)

{
  uint uVar1;
  int *piVar2;
  char *pcVar3;
  LY_ERR LVar4;
  char *pcVar5;
  longdouble in_ST0;
  char *endptr;
  int local_48 [3];
  longdouble local_3c;
  
  if (set == (lyxp_set *)0x0) {
    pcVar3 = "skipped";
LAB_001acdbc:
    pcVar5 = lyxp_token2str(exp->tokens[*tok_idx]);
    LVar4 = LY_SUCCESS;
    ly_log_dbg(2,"%-27s %s %s[%u]","eval_number",pcVar3,pcVar5,(ulong)exp->tok_pos[*tok_idx]);
    *tok_idx = *tok_idx + 1;
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = 0;
    strtold(exp->expr + exp->tok_pos[*tok_idx],(char **)local_48);
    if (*piVar2 == 0) {
      if (exp->tok_len[*tok_idx] == local_48[0] - (exp->tok_pos[*tok_idx] + (int)exp->expr)) {
        local_3c = in_ST0;
        lyxp_set_free_content(set);
        set->type = LYXP_SET_NUMBER;
        (set->val).num = local_3c;
        pcVar3 = "parsed";
        goto LAB_001acdbc;
      }
      ly_vlog(ctx,(char *)0x0,LYVE_XPATH,"Unexpected XPath token \"%s\" (\"%.15s\").","Unknown");
      uVar1 = exp->tok_len[*tok_idx];
      pcVar5 = exp->expr + exp->tok_pos[*tok_idx];
      pcVar3 = "Failed to convert \"%.*s\" into a long double.";
    }
    else {
      ly_vlog(ctx,(char *)0x0,LYVE_XPATH,"Unexpected XPath token \"%s\" (\"%.15s\").","Unknown",
              exp->expr + exp->tok_pos[*tok_idx]);
      uVar1 = exp->tok_len[*tok_idx];
      pcVar5 = exp->expr + exp->tok_pos[*tok_idx];
      strerror(*piVar2);
      pcVar3 = "Failed to convert \"%.*s\" into a long double (%s).";
    }
    ly_vlog(ctx,(char *)0x0,LYVE_XPATH,pcVar3,(ulong)uVar1,pcVar5);
    LVar4 = LY_EVALID;
  }
  return LVar4;
}

Assistant:

static LY_ERR
eval_number(struct ly_ctx *ctx, const struct lyxp_expr *exp, uint32_t *tok_idx, struct lyxp_set *set)
{
    long double num;
    char *endptr;

    if (set) {
        errno = 0;
        num = strtold(&exp->expr[exp->tok_pos[*tok_idx]], &endptr);
        if (errno) {
            LOGVAL(ctx, LY_VCODE_XP_INTOK, "Unknown", &exp->expr[exp->tok_pos[*tok_idx]]);
            LOGVAL(ctx, LYVE_XPATH, "Failed to convert \"%.*s\" into a long double (%s).",
                    (int)exp->tok_len[*tok_idx], &exp->expr[exp->tok_pos[*tok_idx]], strerror(errno));
            return LY_EVALID;
        } else if ((uint32_t)(endptr - &exp->expr[exp->tok_pos[*tok_idx]]) != exp->tok_len[*tok_idx]) {
            LOGVAL(ctx, LY_VCODE_XP_INTOK, "Unknown", &exp->expr[exp->tok_pos[*tok_idx]]);
            LOGVAL(ctx, LYVE_XPATH, "Failed to convert \"%.*s\" into a long double.",
                    (int)exp->tok_len[*tok_idx], &exp->expr[exp->tok_pos[*tok_idx]]);
            return LY_EVALID;
        }

        set_fill_number(set, num);
    }

    LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
            lyxp_token2str(exp->tokens[*tok_idx]), exp->tok_pos[*tok_idx]);
    ++(*tok_idx);
    return LY_SUCCESS;
}